

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O3

boolean successful_cdt(int cdt)

{
  int iVar1;
  
  if (cdt == 0 && u.uconduct.killer == 0) {
    iVar1 = num_genocides();
    if ((iVar1 == 0) && (u.uconduct.weaphit < 0x65)) {
      return '\x01';
    }
  }
  else if (cdt == 1 && u.uconduct.killer == 0) {
    iVar1 = num_genocides();
    if (iVar1 != 0) {
      return '\x01';
    }
    if (100 < u.uconduct.weaphit) {
      return '\x01';
    }
  }
  else {
    if ((cdt == 2) && (u.uconduct.gnostic == 0)) {
      return '\x01';
    }
    if ((cdt == 3) && (u.uconduct.armoruses == 0)) {
      return '\x01';
    }
    if ((cdt == 4) && (u.uconduct.unblinded == 0)) {
      return '\x01';
    }
    if ((cdt == 7) && (u.uconduct.unvegetarian == 0)) {
      return '\x01';
    }
    if ((cdt == 6) && (u.uconduct.unvegan == 0)) {
      return '\x01';
    }
    if ((cdt == 5) && (u.uconduct.food == 0)) {
      return '\x01';
    }
    if ((cdt == 8) && (u.uconduct.literate == 0)) {
      return '\x01';
    }
  }
  return cdt == 9 && u.uconduct.robbed == 0;
}

Assistant:

boolean successful_cdt(int cdt)
{
	if (cdt == CONDUCT_PACIFISM && !u.uconduct.killer &&
		!num_genocides() && u.uconduct.weaphit <= 100)
	    return TRUE;
	if (cdt == CONDUCT_SADISM && !u.uconduct.killer &&
		(num_genocides() || u.uconduct.weaphit > 100))
	    return TRUE;
	if (cdt == CONDUCT_ATHEISM && !u.uconduct.gnostic) return TRUE;
	if (cdt == CONDUCT_NUDISM && !u.uconduct.armoruses) return TRUE;
	if (cdt == CONDUCT_BLINDFOLDED && !u.uconduct.unblinded) return TRUE;
	if (cdt == CONDUCT_VEGETARIAN && !u.uconduct.unvegetarian) return TRUE;
	if (cdt == CONDUCT_VEGAN && !u.uconduct.unvegan) return TRUE;
	if (cdt == CONDUCT_FOODLESS && !u.uconduct.food) return TRUE;
	if (cdt == CONDUCT_ILLITERACY && !u.uconduct.literate) return TRUE;
	if (cdt == CONDUCT_THIEVERY && !u.uconduct.robbed) return TRUE;

	return FALSE;
}